

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O0

bool operator<(IndexCrossing *x,IndexCrossing *y)

{
  IndexCrossing *y_local;
  IndexCrossing *x_local;
  
  if ((x->a).shape_id < (y->a).shape_id) {
    x_local._7_1_ = true;
  }
  else if ((y->a).shape_id < (x->a).shape_id) {
    x_local._7_1_ = false;
  }
  else if ((x->a).edge_id < (y->a).edge_id) {
    x_local._7_1_ = true;
  }
  else if ((y->a).edge_id < (x->a).edge_id) {
    x_local._7_1_ = false;
  }
  else if ((x->b).shape_id < (y->b).shape_id) {
    x_local._7_1_ = true;
  }
  else if ((y->b).shape_id < (x->b).shape_id) {
    x_local._7_1_ = false;
  }
  else {
    x_local._7_1_ = (x->b).edge_id < (y->b).edge_id;
  }
  return x_local._7_1_;
}

Assistant:

bool operator<(const IndexCrossing& x, const IndexCrossing& y) {
      // The compiler (2017) doesn't optimize the following as well:
      // return x.a < y.a || (x.a == y.a && x.b < y.b);
      if (x.a.shape_id < y.a.shape_id) return true;
      if (y.a.shape_id < x.a.shape_id) return false;
      if (x.a.edge_id < y.a.edge_id) return true;
      if (y.a.edge_id < x.a.edge_id) return false;
      if (x.b.shape_id < y.b.shape_id) return true;
      if (y.b.shape_id < x.b.shape_id) return false;
      return x.b.edge_id < y.b.edge_id;
    }